

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

TypeFunction *
GetFunctionTypeFromCache
          (DirectChainedMap<TypeFunction_*> *table,uint hash,TypeBase *returnType,
          IntrusiveList<TypeHandle> arguments)

{
  TypeFunction *pTVar1;
  Node *start;
  Node *pNVar2;
  TypeHandle *pTVar3;
  Node *pNVar5;
  TypeHandle *pTVar6;
  TypeHandle *pTVar7;
  NodeIterator NVar8;
  Node *pNVar4;
  
  pTVar3 = arguments.head;
  NVar8 = DirectChainedMap<TypeFunction_*>::first(table,hash);
  pNVar4 = NVar8.node;
  do {
    if (pNVar4 == (Node *)0x0) {
      return (TypeFunction *)0x0;
    }
    pNVar5 = NVar8.node;
    pNVar2 = NVar8.start;
    pTVar1 = *(TypeFunction **)(pNVar5 + 8);
    if (pTVar1->returnType == returnType) {
      pTVar6 = (pTVar1->arguments).head;
      pTVar7 = pTVar3;
      if (pTVar6 != (TypeHandle *)0x0 && pTVar3 != (TypeHandle *)0x0) {
        while (pTVar6->type == pTVar7->type) {
          pTVar7 = pTVar7->next;
          pTVar6 = pTVar6->next;
          if ((pTVar6 == (TypeHandle *)0x0) || (pTVar7 == (TypeHandle *)0x0)) break;
        }
      }
      if (pTVar6 == pTVar7) {
        return pTVar1;
      }
      pNVar4 = *(Node **)(pNVar5 + 0x10);
      if (pNVar4 != pNVar2) {
        do {
          if (pNVar4 == (Node *)0x0) break;
          if (*(int *)pNVar4 == *(int *)pNVar5) goto LAB_00149402;
          pNVar4 = *(Node **)(pNVar4 + 0x10);
        } while (pNVar4 != pNVar2);
      }
    }
    else {
      pNVar4 = *(Node **)(pNVar5 + 0x10);
      if (pNVar4 != pNVar2) {
        do {
          if (pNVar4 == (Node *)0x0) break;
          if (*(int *)pNVar4 == *(int *)pNVar5) goto LAB_00149402;
          pNVar4 = *(Node **)(pNVar4 + 0x10);
        } while (pNVar4 != pNVar2);
      }
    }
    pNVar4 = (Node *)0x0;
    pNVar2 = (Node *)0x0;
LAB_00149402:
    NVar8.node = pNVar4;
    NVar8.start = pNVar2;
  } while( true );
}

Assistant:

TypeFunction* GetFunctionTypeFromCache(DirectChainedMap<TypeFunction*> &table, unsigned hash, TypeBase* returnType, IntrusiveList<TypeHandle> arguments)
{
	typedef DirectChainedMap<TypeFunction*>::NodeIterator Node;

	if(Node curr = table.first(hash))
	{
		while(curr)
		{
			TypeFunction *type = curr.node->value;

			if(type->returnType != returnType)
			{
				curr = table.next(curr);
				continue;
			}

			TypeHandle *leftArg = type->arguments.head;
			TypeHandle *rightArg = arguments.head;

			while(leftArg && rightArg && leftArg->type == rightArg->type)
			{
				leftArg = leftArg->next;
				rightArg = rightArg->next;
			}

			if(leftArg != rightArg)
			{
				curr = table.next(curr);
				continue;
			}

			return type;
		}
	}

	return NULL;
}